

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O2

bool __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::hasTag
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint64_t tagId)

{
  byte *pbVar1;
  byte bVar2;
  uint64_t uVar3;
  long lVar4;
  
  pbVar1 = *(byte **)this;
  do {
    bVar2 = *pbVar1 & 0xfe;
    if (bVar2 != 0xee) break;
    if (*pbVar1 == 0xee) {
      uVar3 = (uint64_t)pbVar1[1];
      lVar4 = 2;
    }
    else {
      uVar3 = *(uint64_t *)(pbVar1 + 1);
      lVar4 = 9;
    }
    pbVar1 = pbVar1 + lVar4;
  } while (uVar3 != tagId);
  return bVar2 == 0xee;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }